

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::set_empty_key(dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                *this,key_type *key)

{
  int iVar1;
  size_type sVar2;
  undefined1 auVar3 [16];
  pointer pAVar4;
  long lVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ = true;
  iVar1 = key->_i;
  (this->key_info).empty_key._i = iVar1;
  A::copy_assign = A::copy_assign + 1;
  sVar2 = this->num_buckets;
  pAVar4 = (pointer)malloc(sVar2 * 4);
  this->table = pAVar4;
  auVar3 = _DAT_00a8f670;
  if (sVar2 != 0) {
    lVar5 = sVar2 - 1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_00a8f670;
    auVar9 = _DAT_00a8f650;
    auVar10 = _DAT_00a8f660;
    do {
      auVar11 = auVar10 ^ auVar3;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_)
                & 1)) {
        pAVar4[uVar6]._i = iVar1;
      }
      if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
          auVar11._12_4_ <= auVar7._12_4_) {
        pAVar4[uVar6 + 1]._i = iVar1;
      }
      auVar11 = auVar9 ^ auVar3;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
        pAVar4[uVar6 + 2]._i = iVar1;
        pAVar4[uVar6 + 3]._i = iVar1;
      }
      uVar6 = uVar6 + 4;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar5 + 4;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar5 + 4;
    } while ((sVar2 + 3 & 0xfffffffffffffffc) != uVar6);
    A::copy_ctor = A::copy_ctor + (int)sVar2;
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }